

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

void __thiscall irr::core::string<char>::string(string<char> *this,unsigned_long number)

{
  string *in_RDI;
  string local_30 [24];
  unsigned_long in_stack_ffffffffffffffe8;
  
  ::std::__cxx11::string::string(in_RDI);
  ::std::__cxx11::to_string(in_stack_ffffffffffffffe8);
  ::std::__cxx11::string::operator=(in_RDI,local_30);
  ::std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

explicit string(unsigned long number)
	{
		str = std::to_string(number);
	}